

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

void __thiscall
kratos::Context::change_generator_name(Context *this,Generator *generator,string *new_name)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  Context *pCVar4;
  set<std::shared_ptr<kratos::Generator>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
  *this_00;
  unordered_set<std::shared_ptr<kratos::Generator>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *this_01;
  __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *peVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar6 [16];
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  value_type *g;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<std::shared_ptr<kratos::Generator>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *__range1;
  string local_258;
  _Self local_238;
  _Base_ptr local_230;
  _Rb_tree_const_iterator<std::shared_ptr<kratos::Generator>_> local_228;
  _Self local_220;
  _Rb_tree_const_iterator<std::shared_ptr<kratos::Generator>_> pos;
  mapped_type *list;
  string local_208;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
  local_1e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
  local_1e0;
  undefined1 local_1d8 [8];
  shared_ptr<kratos::Generator> shared_ptr;
  string local_1b8;
  v7 *local_198;
  string *old_name;
  string *new_name_local;
  Generator *generator_local;
  Context *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_170;
  basic_string_view<char> local_168;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_158;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_138;
  string *local_130;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_128;
  basic_string_view<char> local_118;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_108;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_e8;
  string *local_e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  basic_string_view<char> local_c8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  char *local_90;
  string *local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_60;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_48;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_40;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  old_name = new_name;
  new_name_local = (string *)generator;
  generator_local = (Generator *)this;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) || (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
    std::__cxx11::string::operator=
              ((string *)(new_name_local[3].field_2._M_local_buf + 8),(string *)old_name);
    return;
  }
  local_198 = (v7 *)((long)&new_name_local[3].field_2 + 8);
  pCVar4 = Generator::context((Generator *)new_name_local);
  if (pCVar4 != this) {
    shared_ptr.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _3_1_ = 1;
    auVar6 = __cxa_allocate_exception(0x10);
    local_e0 = &local_1b8;
    local_e8 = "{0}\'s context is different";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_198;
    local_108.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string_const&,char[27],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"{0}\'s context is different",local_198,auVar6._8_8_,
                    (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                    "{0}\'s context is different");
    local_f8 = &local_108;
    local_118 = fmt::v7::to_string_view<char,_0>(local_e8);
    local_68 = &local_128;
    local_70 = local_f8;
    local_40 = local_f8;
    local_18 = local_f8;
    local_38 = local_68;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_68,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_f8->string);
    format_str.size_ = local_128.desc_;
    format_str.data_ = (char *)local_118.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_128.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_1b8,(detail *)local_118.data_,format_str,args);
    UserException::UserException(auVar6._0_8_,&local_1b8);
    shared_ptr.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _3_1_ = 0;
    __cxa_throw(auVar6._0_8_,&UserException::typeinfo,UserException::~UserException);
  }
  std::enable_shared_from_this<kratos::Generator>::shared_from_this
            ((enable_shared_from_this<kratos::Generator> *)local_1d8);
  local_1e0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>_>
       ::find(&this->modules_,(key_type *)((long)&new_name_local[3].field_2 + 8));
  local_1e8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>_>
       ::end(&this->modules_);
  bVar2 = std::__detail::operator==(&local_1e0,&local_1e8);
  if (!bVar2) {
    pos._M_node = (_Base_ptr)
                  std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>_>
                  ::at(&this->modules_,(key_type *)((long)&new_name_local[3].field_2 + 8));
    local_228._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
         ::begin((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  *)pos._M_node);
    local_230 = (_Base_ptr)
                std::
                set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                ::end(pos._M_node);
    local_220._M_node =
         (_Base_ptr)
         std::
         find<std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Generator>>,std::shared_ptr<kratos::Generator>>
                   (local_228,
                    (_Rb_tree_const_iterator<std::shared_ptr<kratos::Generator>_>)local_230,
                    (shared_ptr<kratos::Generator> *)local_1d8);
    local_238._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
         ::end(pos._M_node);
    bVar2 = std::operator==(&local_220,&local_238);
    if (!bVar2) {
      std::
      set<std::shared_ptr<kratos::Generator>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
      ::erase_abi_cxx11_((set<std::shared_ptr<kratos::Generator>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
                          *)pos._M_node,(const_iterator)local_220._M_node);
      std::__cxx11::string::operator=
                ((string *)(new_name_local[3].field_2._M_local_buf + 8),(string *)old_name);
      this_00 = (set<std::shared_ptr<kratos::Generator>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
                 *)std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>_>
                   ::operator[](&this->modules_,old_name);
      std::
      set<std::shared_ptr<kratos::Generator>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
      ::emplace<std::shared_ptr<kratos::Generator>&>
                (this_00,(shared_ptr<kratos::Generator> *)local_1d8);
      this_01 = Generator::get_clones((Generator *)new_name_local);
      __end1 = std::
               unordered_set<std::shared_ptr<kratos::Generator>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               ::begin(this_01);
      g = (value_type *)
          std::
          unordered_set<std::shared_ptr<kratos::Generator>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
          ::end(this_01);
      while (bVar2 = std::__detail::operator!=
                               (&__end1.
                                 super__Node_iterator_base<std::shared_ptr<kratos::Generator>,_false>
                                ,(_Node_iterator_base<std::shared_ptr<kratos::Generator>,_false> *)
                                 &g), bVar2) {
        this_02 = (__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::__detail::
                     _Node_const_iterator<std::shared_ptr<kratos::Generator>,_true,_false>::
                     operator*(&__end1);
        psVar1 = old_name;
        peVar5 = std::
                 __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_02);
        std::__cxx11::string::operator=((string *)&peVar5->name,(string *)psVar1);
        std::__detail::_Node_const_iterator<std::shared_ptr<kratos::Generator>,_true,_false>::
        operator++(&__end1);
      }
      std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)local_1d8);
      return;
    }
    auVar6 = __cxa_allocate_exception(0x10);
    local_88 = &local_258;
    local_90 = "unable to find generator {0} in context";
    vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_198;
    local_b8.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string_const&,char[40],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"unable to find generator {0} in context",local_198,auVar6._8_8_,
                    (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                    "unable to find generator {0} in context");
    local_a0 = &local_b8;
    local_c8 = fmt::v7::to_string_view<char,_0>(local_90);
    local_78 = &local_d8;
    local_80 = local_a0;
    local_30 = local_a0;
    local_20 = local_a0;
    local_28 = local_78;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_78,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_a0->string);
    format_str_01.size_ = local_d8.desc_;
    format_str_01.data_ = (char *)local_c8.size_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_d8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_258,(detail *)local_c8.data_,format_str_01,args_01);
    UserException::UserException(auVar6._0_8_,&local_258);
    __cxa_throw(auVar6._0_8_,&UserException::typeinfo,UserException::~UserException);
  }
  auVar6 = __cxa_allocate_exception(0x10);
  local_130 = &local_208;
  local_138 = "cannot find generator {0} in context";
  vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_198;
  local_158.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string_const&,char[37],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"cannot find generator {0} in context",local_198,auVar6._8_8_,
                  (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                  "cannot find generator {0} in context");
  local_148 = &local_158;
  local_168 = fmt::v7::to_string_view<char,_0>(local_138);
  local_58 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_60 = local_148;
  local_50 = local_148;
  local_10 = local_148;
  local_48 = local_58;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_58,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_148->string);
  format_str_00.size_ = (size_t)this_local;
  format_str_00.data_ = (char *)local_168.size_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_170.values_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_208,(detail *)local_168.data_,format_str_00,args_00);
  UserException::UserException(auVar6._0_8_,&local_208);
  __cxa_throw(auVar6._0_8_,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

void Context::change_generator_name(Generator *generator, const std::string &new_name) {
    if (new_name.empty() || generator->name.empty()) {
        // don't care names
        generator->name = new_name;
        return;
    }
    // first we need to make sure that the generator is within the context
    auto const &old_name = generator->name;
    if (generator->context() != this)
        throw UserException(::format("{0}'s context is different", old_name));
    // remove it from the list
    auto shared_ptr = generator->shared_from_this();
    if (modules_.find(generator->name) == modules_.end()) {
        // this only happens if the context is cleared or switched
        throw UserException(::format("cannot find generator {0} in context", old_name));
    }
    auto &list = modules_.at(generator->name);
    auto pos = std::find(list.begin(), list.end(), shared_ptr);
    if (pos == list.end())
        throw UserException(::format("unable to find generator {0} in context", old_name));
    // we need to erase it
    list.erase(pos);
    // change its name and put it to a new list
    generator->name = new_name;
    modules_[new_name].emplace(shared_ptr);
    // change the cloned names as well
    for (const auto &g : generator->get_clones()) {
        g->name = new_name;
    }
}